

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O0

bool __thiscall xmrig::DaemonClient::parseJob(DaemonClient *this,Value *params,int *code)

{
  bool bVar1;
  SocketState state;
  uint64_t uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  uchar *__first;
  reference pvVar4;
  undefined4 *in_RDX;
  undefined8 in_RSI;
  size_type sVar5;
  long in_RDI;
  uint64_t extra_iters;
  uint32_t id_num;
  uint8_t id_num_bytes [4];
  int read;
  uint64_t t_stamp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> b;
  size_t blob_size;
  uint8_t *blob;
  String blocktemplate;
  Job job;
  Job *in_stack_fffffffffffffd98;
  Job *in_stack_fffffffffffffda0;
  Job *in_stack_fffffffffffffda8;
  String *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  DaemonClient *this_00;
  String *in_stack_fffffffffffffdc8;
  allocator_type *__a;
  Job *in_stack_fffffffffffffdd0;
  uchar *__last;
  uint local_1b8;
  undefined4 local_1b4;
  uchar *local_1b0;
  uchar *local_1a8;
  SocketState local_19c;
  ulong local_198;
  uchar local_189;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_188;
  uchar *local_170;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_168;
  undefined4 local_15c;
  String local_158 [3];
  Job local_128;
  undefined4 *local_20;
  undefined8 local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  String::String(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  Job::Job(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  String::~String((String *)in_stack_fffffffffffffda0);
  Json::getString((Value *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                  (char *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  String::String(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  bVar1 = String::isNull(local_158);
  if (!bVar1) {
    Json::getString((Value *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                    (char *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
    bVar1 = Job::setBlob(in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
    if (bVar1) {
      uVar2 = Json::getUint64((Value *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8)
                              ,(char *)in_stack_fffffffffffffdb0,(uint64_t)in_stack_fffffffffffffda8
                             );
      Job::setHeight(&local_128,uVar2);
      Json::getUint64((Value *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                      (char *)in_stack_fffffffffffffdb0,(uint64_t)in_stack_fffffffffffffda8);
      Job::setDiff(in_stack_fffffffffffffda0,(uint64_t)in_stack_fffffffffffffd98);
      String::data(local_158);
      String::size(local_158);
      Job::setId(in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
      Job::operator=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      String::operator=((String *)in_stack_fffffffffffffda0,(String *)in_stack_fffffffffffffd98);
      Json::getString((Value *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                      (char *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
      String::operator=((String *)in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
      pvVar3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               Job::blob((Job *)(in_RDI + 0x28));
      local_168 = pvVar3;
      __first = (uchar *)Job::size((Job *)(in_RDI + 0x28));
      this_00 = (DaemonClient *)
                ((long)&(local_168->
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                        super__Vector_impl_data._M_start + 2);
      __a = (allocator_type *)(__first + -2 + (long)local_168);
      __last = &local_189;
      local_170 = __first;
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1eb901);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                (pvVar3,__first,__last,__a);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1eb92c);
      local_198 = 0;
      pvVar3 = &local_188;
      local_1a8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      in_stack_fffffffffffffd98);
      local_1b0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      in_stack_fffffffffffffd98);
      state = tools::
              read_varint<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_long>
                        ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_fffffffffffffda0,
                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_fffffffffffffd98,(unsigned_long *)0x1eb981);
      local_19c = state;
      memset(&local_1b4,0,4);
      sVar5 = (size_type)(int)local_19c;
      local_19c = local_19c + HostLookupState;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&local_188,sVar5);
      local_1b4._0_3_ = CONCAT12(*pvVar4,(undefined2)local_1b4);
      sVar5 = (size_type)(int)local_19c;
      local_19c = local_19c + 1;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&local_188,sVar5);
      local_1b4._0_2_ = CONCAT11(*pvVar4,(undefined1)local_1b4);
      sVar5 = (size_type)(int)local_19c;
      local_19c = local_19c + 1;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&local_188,sVar5);
      local_1b4 = CONCAT31(local_1b4._1_3_,*pvVar4);
      local_1b8 = local_1b4;
      if (local_1b4 == 0) {
        local_1b8 = 1;
      }
      in_stack_fffffffffffffda0 = (Job *)(local_198 % (ulong)local_1b8);
      uVar2 = Job::height(&local_128);
      Job::setExtraIters((Job *)(in_RDI + 0x28),
                         (ulong)((int)in_stack_fffffffffffffda0 + (int)uVar2 & 0x7fff));
      if (*(int *)(in_RDI + 0x1e8) == 2) {
        setState(this_00,state);
      }
      (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))
                (*(long **)(in_RDI + 0x10),in_RDI,in_RDI + 0x28,local_18);
      local_1 = 1;
      local_15c = 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(pvVar3);
      goto LAB_001ebb69;
    }
  }
  *local_20 = 4;
  local_1 = 0;
  local_15c = 1;
LAB_001ebb69:
  String::~String((String *)in_stack_fffffffffffffda0);
  Job::~Job(in_stack_fffffffffffffda0);
  return (bool)(local_1 & 1);
}

Assistant:

bool xmrig::DaemonClient::parseJob(const rapidjson::Value &params, int *code)
{
    Job job("");

    String blocktemplate = Json::getString(params, kBlocktemplateBlob);
    if (blocktemplate.isNull() || !job.setBlob(Json::getString(params, "blockhashing_blob"))) {
        *code = 4;
        return false;
    }

    job.setHeight(Json::getUint64(params, kHeight));
    job.setDiff(Json::getUint64(params, "difficulty"));
    job.setId(blocktemplate.data() + blocktemplate.size() - 32);

    m_job           = std::move(job);
    m_blocktemplate = std::move(blocktemplate);
    m_prevHash      = Json::getString(params, "prev_hash");

    const uint8_t* blob = m_job.blob();
    size_t blob_size = m_job.size();

    std::vector<uint8_t> b(blob + 2, blob + (blob_size - 2));
    uint64_t t_stamp = 0;
    int read = tools::read_varint(b.begin(), b.end(), t_stamp);

    uint8_t id_num_bytes[4] = {0};
    id_num_bytes[2] = b[read++];
    id_num_bytes[1] = b[read++];
    id_num_bytes[0] = b[read++];

    uint32_t id_num = *((uint32_t*)id_num_bytes);

    if (id_num < 1)
        id_num = 1;

    uint64_t extra_iters = ((t_stamp % id_num) + job.height()) & 0x7FFF;

    m_job.setExtraIters(extra_iters);

    if (m_state == ConnectingState) {
        setState(ConnectedState);
    }

    m_listener->onJobReceived(this, m_job, params);
    return true;
}